

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall QTableWidget::setItem(QTableWidget *this,int row,int column,QTableWidgetItem *item)

{
  QTableWidgetPrivate *file;
  QTableWidgetItem *pQVar1;
  QMessageLogger *in_RCX;
  char *in_RDI;
  long in_FS_OFFSET;
  QTableWidgetPrivate *d;
  char *in_stack_ffffffffffffffa8;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  file = d_func((QTableWidget *)0x8d5f87);
  if (in_RCX == (QMessageLogger *)0x0) {
    pQVar1 = takeItem((QTableWidget *)0x0,(int)((ulong)file >> 0x20),(int)file);
    if (pQVar1 != (QTableWidgetItem *)0x0) {
      (*pQVar1->_vptr_QTableWidgetItem[1])();
    }
  }
  else if (in_RCX[1].context.file == (char *)0x0) {
    in_RCX[1].context.file = in_RDI;
    QTableWidgetPrivate::tableModel((QTableWidgetPrivate *)0x8d5feb);
    QTableModel::setItem
              ((QTableModel *)CONCAT44(row,column),item._4_4_,(int)item,(QTableWidgetItem *)d);
  }
  else {
    QMessageLogger::QMessageLogger
              (in_RCX,(char *)file,(int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffa8);
    QMessageLogger::warning
              (local_28,
               "QTableWidget: cannot insert an item that is already owned by another QTableWidget");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableWidget::setItem(int row, int column, QTableWidgetItem *item)
{
    Q_D(QTableWidget);
    if (item) {
        if (Q_UNLIKELY(item->view)) {
            qWarning("QTableWidget: cannot insert an item that is already owned by another QTableWidget");
        } else {
            item->view = this;
            d->tableModel()->setItem(row, column, item);
        }
    } else {
        delete takeItem(row, column);
    }
}